

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureCopy_24_to_32(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  u32 dx_1;
  uint uVar6;
  u32 dy;
  uint uVar7;
  byte *pbVar8;
  u32 dy_1;
  uint uVar9;
  u32 dx;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  
  uVar5 = (ulong)job->width;
  uVar6 = job->height;
  pvVar4 = job->dst;
  if (job->stretch == true) {
    fVar1 = (float)job->x_stretch;
    fVar2 = (float)job->y_stretch;
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      uVar9 = (int)(long)((float)uVar7 * fVar2) * job->srcPitch;
      pvVar3 = job->src;
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        uVar12 = (long)((float)(uVar10 & 0xffffffff) * fVar1 * 3.0) & 0xffffffff;
        *(uint *)((long)pvVar4 + uVar10 * 4) =
             (uint)*(byte *)((long)pvVar3 + uVar12 + (ulong)uVar9 + 2) |
             (uint)*(byte *)((long)pvVar3 + uVar12 + (ulong)uVar9 + 1) << 8 |
             (uint)*(byte *)((long)pvVar3 + uVar12 + uVar9) << 0x10 | 0xff000000;
      }
      pvVar4 = (void *)((long)pvVar4 + (ulong)job->dstPitch);
    }
  }
  else {
    pbVar8 = (byte *)job->src;
    for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      pbVar11 = pbVar8;
      for (uVar10 = 0; uVar10 < uVar5; uVar10 = uVar10 + 1) {
        *(uint *)((long)pvVar4 + uVar10 * 4) =
             (uint)pbVar11[2] | (uint)pbVar11[1] << 8 | (uint)*pbVar11 << 0x10 | 0xff000000;
        pbVar11 = pbVar11 + 3;
        uVar5 = (ulong)job->width;
      }
      pbVar8 = pbVar8 + job->srcPitch;
      uVar6 = job->height;
      pvVar4 = (void *)((long)pvVar4 + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_32(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u32 *dst = static_cast<u32 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (const u8 *)job->src + (job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *s = src + (u32)(dx * wscale);
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
			}
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy < job->height; ++dy) {
			const u8 *s = src;

			for (u32 dx = 0; dx < job->width; ++dx) {
				dst[dx] = 0xFF000000 | s[0] << 16 | s[1] << 8 | s[2];
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u32 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}